

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O3

REF_STATUS ref_split_edge_mixed(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  REF_BOOL qua_side;
  REF_BOOL hex_side;
  REF_BOOL pri_side;
  REF_BOOL pyr_side;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  uVar1 = ref_cell_has_side(ref_grid->cell[9],node0,node1,&local_2c);
  if (uVar1 == 0) {
    uVar1 = ref_cell_has_side(ref_grid->cell[10],node0,node1,&local_30);
    if (uVar1 == 0) {
      uVar1 = ref_cell_has_side(ref_grid->cell[0xb],node0,node1,&local_34);
      if (uVar1 == 0) {
        uVar1 = ref_cell_has_side(ref_grid->cell[6],node0,node1,&local_38);
        if (uVar1 == 0) {
          *allowed = (uint)(((local_30 == 0 && local_2c == 0) && local_34 == 0) && local_38 == 0);
          return 0;
        }
        pcVar3 = "qua";
        uVar2 = 0x23b;
      }
      else {
        pcVar3 = "hex";
        uVar2 = 0x239;
      }
    }
    else {
      pcVar3 = "pri";
      uVar2 = 0x237;
    }
  }
  else {
    pcVar3 = "pyr";
    uVar2 = 0x235;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",uVar2,
         "ref_split_edge_mixed",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_mixed(REF_GRID ref_grid, REF_INT node0,
                                        REF_INT node1, REF_BOOL *allowed) {
  REF_BOOL pyr_side, pri_side, hex_side, qua_side;

  RSS(ref_cell_has_side(ref_grid_pyr(ref_grid), node0, node1, &pyr_side),
      "pyr");
  RSS(ref_cell_has_side(ref_grid_pri(ref_grid), node0, node1, &pri_side),
      "pri");
  RSS(ref_cell_has_side(ref_grid_hex(ref_grid), node0, node1, &hex_side),
      "hex");
  RSS(ref_cell_has_side(ref_grid_qua(ref_grid), node0, node1, &qua_side),
      "qua");

  *allowed = (!pyr_side && !pri_side && !hex_side && !qua_side);

  return REF_SUCCESS;
}